

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::UaddCarryCase::compare(UaddCarryCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  uint uVar2;
  uint uVar3;
  pointer pSVar4;
  uint uVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  Hex<8UL> hex;
  ulong uVar9;
  ulong uVar10;
  
  pSVar4 = (this->super_IntegerFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar4->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar4->varType).m_data.basic.type);
  uVar10 = 0;
  uVar9 = 0;
  if (0 < (int)uVar5) {
    uVar9 = (ulong)uVar5;
  }
  do {
    if (uVar9 == uVar10) {
LAB_0047fc06:
      return (long)(int)uVar5 <= (long)uVar10;
    }
    uVar2 = *(uint *)((long)*inputs + uVar10 * 4);
    uVar3 = *(uint *)((long)inputs[1] + uVar10 * 4);
    uVar7 = uVar2 + uVar3;
    uVar8 = (ulong)uVar3 + (ulong)uVar2;
    if ((((*(uint *)((long)*outputs + uVar10 * 4) ^ uVar7) &
         (2 << ((&DAT_00818ab0)[(ulong)PVar1 * 4] - 1 & 0x1f)) - 1U) != 0) ||
       (*(int *)((long)outputs[1] + uVar10 * 4) != (int)(uVar8 >> 0x20))) {
      poVar6 = std::operator<<((ostream *)&(this->super_IntegerFunctionCase).m_failMsg,"Expected [")
      ;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar10);
      poVar6 = std::operator<<(poVar6,"] = ");
      hex.value._4_4_ = 0;
      hex.value._0_4_ = uVar7;
      poVar6 = tcu::Format::operator<<(poVar6,hex);
      poVar6 = std::operator<<(poVar6,", ");
      tcu::Format::operator<<(poVar6,(Hex<8UL>)(uVar8 >> 0x20));
      goto LAB_0047fc06;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);
		const deUint32			mask0			= getLowBitMask(integerLength);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	in0		= ((const deUint32*)inputs[0])[compNdx];
			const deUint32	in1		= ((const deUint32*)inputs[1])[compNdx];
			const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	out1	= ((const deUint32*)outputs[1])[compNdx];
			const deUint32	ref0	= in0+in1;
			const deUint32	ref1	= (deUint64(in0)+deUint64(in1)) > 0xffffffffu ? 1u : 0u;

			if (((out0&mask0) != (ref0&mask0)) || out1 != ref1)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(ref0) << ", " << tcu::toHex(ref1);
				return false;
			}
		}

		return true;
	}